

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParameterErrorsTest::PrepareObjects
          (GetParameterErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  long lVar7;
  bool bVar8;
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1a0f);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1a12);
  GVar5 = this->m_parameter_invalid;
  do {
    GVar5 = GVar5 + 1;
    bVar8 = false;
    for (lVar7 = 0; lVar7 != 0x2c; lVar7 = lVar7 + 4) {
      bVar8 = (bool)(bVar8 | *(GLuint *)((long)PrepareObjects::valid_parameters + lVar7) == GVar5);
    }
  } while (bVar8);
  this->m_parameter_invalid = GVar5;
  do {
    pcVar1 = *(code **)(lVar6 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  return;
}

Assistant:

void GetParameterErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid target. */
	bool is_parameter = true;

	while (is_parameter)
	{
		is_parameter = false;

		++m_parameter_invalid;

		static const glw::GLenum valid_parameters[] = { GL_FRAMEBUFFER_DEFAULT_WIDTH,
														GL_FRAMEBUFFER_DEFAULT_HEIGHT,
														GL_FRAMEBUFFER_DEFAULT_LAYERS,
														GL_FRAMEBUFFER_DEFAULT_SAMPLES,
														GL_FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS,
														GL_DOUBLEBUFFER,
														GL_IMPLEMENTATION_COLOR_READ_FORMAT,
														GL_IMPLEMENTATION_COLOR_READ_TYPE,
														GL_SAMPLES,
														GL_SAMPLE_BUFFERS,
														GL_STEREO };

		static const glw::GLuint valid_parameters_count = sizeof(valid_parameters) / sizeof(valid_parameters[0]);

		for (glw::GLuint i = 0; i < valid_parameters_count; ++i)
		{
			if (valid_parameters[i] == m_parameter_invalid)
			{
				is_parameter = true;
			}
		}
	}

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
}